

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::BeginRenderPass
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,BeginRenderPassAttribs *Attribs)

{
  RefCntAutoPtr<Diligent::FramebufferGLImpl> *this_00;
  Uint32 *Args;
  RESOURCE_STATE RequiredState;
  RenderPassGLImpl *pRVar1;
  FramebufferGLImpl *pFVar2;
  ITextureView *pIVar3;
  BeginRenderPassAttribs *pBVar4;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_01;
  COMMAND_QUEUE_TYPE CVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  TextureImplType *Texture;
  COMMAND_QUEUE_TYPE in_DL;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  ulong uVar9;
  char *in_R8;
  char (*in_R9) [8];
  long lVar10;
  string msg;
  char (*in_stack_ffffffffffffff58) [2];
  string local_a0;
  undefined4 local_80;
  RESOURCE_STATE local_7c;
  undefined2 local_78;
  BeginRenderPassAttribs *local_70;
  DeviceContextBase<Diligent::EngineGLImplTraits> *local_68;
  RenderPassGLImpl *local_60;
  RENDER_DEVICE_TYPE local_54;
  String local_50;
  undefined4 extraout_var_00;
  
  CVar5 = (this->m_Desc).QueueType;
  local_70 = Attribs;
  if (CVar5 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_a0,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_a0._M_dataplus._M_p,"BeginRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                                 local_a0.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    FormatString<char[97]>
              (&local_a0,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_a0._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5b8);
    in_DL = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                               local_a0.field_2._M_allocated_capacity._0_4_) + 1);
      in_DL = extraout_DL_00;
    }
    CVar5 = (this->m_Desc).QueueType;
  }
  if ((~CVar5 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_50,(Diligent *)(ulong)CVar5,in_DL);
    in_R8 = " queue.";
    FormatString<char[16],char[22],std::__cxx11::string,char[8]>
              (&local_a0,(Diligent *)0x808dde,(char (*) [16])0x90701a,(char (*) [22])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (local_a0._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                               local_a0.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  pRVar1 = (this->m_pActiveRenderPass).m_pObject;
  if (pRVar1 != (RenderPassGLImpl *)0x0) {
    FormatString<char[61],char_const*,char[14]>
              (&local_a0,(Diligent *)"Attempting to begin render pass while another render pass (\'"
               ,(char (*) [61])
                &(pRVar1->super_RenderPassBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                 .m_Desc,(char **)"\') is active.",(char (*) [14])in_R8);
    DebugAssertionFailed
              (local_a0._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5b9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                               local_a0.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  pFVar2 = (this->m_pBoundFramebuffer).m_pObject;
  if (pFVar2 != (FramebufferGLImpl *)0x0) {
    FormatString<char[61],char_const*,char[13]>
              (&local_a0,(Diligent *)"Attempting to begin render pass while another framebuffer (\'"
               ,(char (*) [61])
                &(pFVar2->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                 .m_Desc,(char **)"\') is bound.",(char (*) [13])in_R8);
    DebugAssertionFailed
              (local_a0._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5ba);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                               local_a0.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  pBVar4 = local_70;
  VerifyBeginRenderPassAttribs(local_70);
  (*(this->super_ObjectBase<Diligent::IDeviceContextGL>).
    super_RefCountedObject<Diligent::IDeviceContextGL>.super_IDeviceContextGL.super_IDeviceContext.
    super_IObject._vptr_IObject[0x51])(this);
  local_60 = (RenderPassGLImpl *)pBVar4->pRenderPass;
  if (local_60 != (RenderPassGLImpl *)0x0) {
    CheckDynamicType<Diligent::RenderPassGLImpl,Diligent::IRenderPass>((IRenderPass *)local_60);
  }
  pFVar2 = (FramebufferGLImpl *)local_70->pFramebuffer;
  local_68 = this;
  if (pFVar2 != (FramebufferGLImpl *)0x0) {
    CheckDynamicType<Diligent::FramebufferGLImpl,Diligent::IFramebuffer>((IFramebuffer *)pFVar2);
  }
  if (local_70->StateTransitionMode != RESOURCE_STATE_TRANSITION_MODE_NONE) {
    Args = &(pFVar2->super_FramebufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            .m_Desc.AttachmentCount;
    uVar7 = (pFVar2->super_FramebufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            .m_Desc.AttachmentCount;
    if (uVar7 < (local_60->super_RenderPassBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                .m_Desc.AttachmentCount) {
      FormatString<char[28],unsigned_int,char[96],unsigned_int,char[2]>
                (&local_a0,(Diligent *)"The number of attachments (",(char (*) [28])Args,
                 (uint *)
                 ") in currently bound framebuffer is smaller than the number of attachments in the render pass ("
                 ,(char (*) [96])
                  &(local_60->super_RenderPassBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                   .m_Desc.AttachmentCount,(uint *)0x920060,in_stack_ffffffffffffff58);
      DebugAssertionFailed
                (local_a0._M_dataplus._M_p,"BeginRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5c9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                                 local_a0.field_2._M_allocated_capacity._0_4_) + 1);
      }
      uVar7 = *Args;
    }
    if (uVar7 != 0) {
      local_54 = (((local_68->m_pDevice).m_pObject)->
                 super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
      lVar10 = 8;
      uVar9 = 0;
      do {
        pIVar3 = (pFVar2->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                 .m_Desc.ppAttachments[uVar9];
        if (pIVar3 != (ITextureView *)0x0) {
          if (local_54 == RENDER_DEVICE_TYPE_METAL) {
            iVar8 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar3);
            if (*(char *)(CONCAT44(extraout_var,iVar8) + 8) == '\x06') goto LAB_0032f53f;
          }
          iVar8 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar3);
          Texture = (TextureImplType *)CONCAT44(extraout_var_00,iVar8);
          if (Texture != (TextureImplType *)0x0) {
            CheckDynamicType<Diligent::TextureBaseGL,Diligent::ITexture>((ITexture *)Texture);
          }
          RequiredState =
               *(RESOURCE_STATE *)
                ((long)&((local_60->super_RenderPassBase<Diligent::EngineGLImplTraits>).
                         super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                         .m_Desc.pAttachments)->Format + lVar10);
          if (local_70->StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY) {
            DvpVerifyTextureState(local_68,Texture,RequiredState,"BeginRenderPass");
          }
          else if ((local_70->StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) &&
                  ((Texture->super_TextureBase<Diligent::EngineGLImplTraits>).m_State !=
                   RESOURCE_STATE_UNKNOWN)) {
            bVar6 = TextureBase<Diligent::EngineGLImplTraits>::CheckState
                              ((TextureBase<Diligent::EngineGLImplTraits> *)Texture,RequiredState);
            if (!bVar6) {
              local_a0._M_dataplus._M_p = (Char *)0x0;
              local_a0.field_2._M_allocated_capacity._0_4_ = 0;
              local_a0.field_2._M_allocated_capacity._4_4_ = 0xffffffff;
              local_a0.field_2._8_4_ = 0;
              local_a0.field_2._12_4_ = 0xffffffff;
              local_80 = 0;
              local_78 = 0x100;
              local_a0._M_string_length = (size_type)Texture;
              local_7c = RequiredState;
              (*(local_68->super_ObjectBase<Diligent::IDeviceContextGL>).
                super_RefCountedObject<Diligent::IDeviceContextGL>.super_IDeviceContextGL.
                super_IDeviceContext.super_IObject._vptr_IObject[0x36])(local_68,1,&local_a0);
            }
          }
        }
LAB_0032f53f:
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar9 < *Args);
    }
  }
  this_01 = local_68;
  this_00 = &local_68->m_pBoundFramebuffer;
  RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator=(&local_68->m_pActiveRenderPass,local_60);
  RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator=(this_00,pFVar2);
  this_01->m_SubpassIndex = 0;
  this_01->m_RenderPassAttachmentsTransitionMode = local_70->StateTransitionMode;
  UpdateAttachmentStates(this_01,0);
  SetSubpassRenderTargets(this_01);
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::BeginRenderPass(const BeginRenderPassAttribs& Attribs)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "BeginRenderPass");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Attempting to begin render pass while another render pass ('", m_pActiveRenderPass->GetDesc().Name, "') is active.");
    DEV_CHECK_ERR(m_pBoundFramebuffer == nullptr, "Attempting to begin render pass while another framebuffer ('", m_pBoundFramebuffer->GetDesc().Name, "') is bound.");

    VerifyBeginRenderPassAttribs(Attribs);

    // Reset current render targets (in Vulkan backend, this may end current render pass).
    ResetRenderTargets();

    RenderPassImplType*  pNewRenderPass  = ClassPtrCast<RenderPassImplType>(Attribs.pRenderPass);
    FramebufferImplType* pNewFramebuffer = ClassPtrCast<FramebufferImplType>(Attribs.pFramebuffer);
    if (Attribs.StateTransitionMode != RESOURCE_STATE_TRANSITION_MODE_NONE)
    {
        const RenderPassDesc&  RPDesc = pNewRenderPass->GetDesc();
        const FramebufferDesc& FBDesc = pNewFramebuffer->GetDesc();
        DEV_CHECK_ERR(RPDesc.AttachmentCount <= FBDesc.AttachmentCount,
                      "The number of attachments (", FBDesc.AttachmentCount,
                      ") in currently bound framebuffer is smaller than the number of attachments in the render pass (", RPDesc.AttachmentCount, ")");
        const bool IsMetal = m_pDevice->GetDeviceInfo().IsMetalDevice();
        for (Uint32 i = 0; i < FBDesc.AttachmentCount; ++i)
        {
            ITextureView* pView = FBDesc.ppAttachments[i];
            if (pView == nullptr)
                continue;

            if (IsMetal && pView->GetDesc().ViewType == TEXTURE_VIEW_SHADING_RATE)
                continue;

            TextureImplType* pTex          = ClassPtrCast<TextureImplType>(pView->GetTexture());
            RESOURCE_STATE   RequiredState = RPDesc.pAttachments[i].InitialState;
            if (Attribs.StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
            {
                if (pTex->IsInKnownState() && !pTex->CheckState(RequiredState))
                {
                    StateTransitionDesc Barrier{pTex, RESOURCE_STATE_UNKNOWN, RequiredState, STATE_TRANSITION_FLAG_UPDATE_STATE};
                    this->TransitionResourceStates(1, &Barrier);
                }
            }
            else if (Attribs.StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY)
            {
                DvpVerifyTextureState(*pTex, RequiredState, "BeginRenderPass");
            }
        }
    }

    m_pActiveRenderPass                   = pNewRenderPass;
    m_pBoundFramebuffer                   = pNewFramebuffer;
    m_SubpassIndex                        = 0;
    m_RenderPassAttachmentsTransitionMode = Attribs.StateTransitionMode;

    UpdateAttachmentStates(m_SubpassIndex);
    SetSubpassRenderTargets();
}